

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBFileStream.cpp
# Opt level: O2

void __thiscall
TPZBFileStream::WriteData<std::complex<double>>(TPZBFileStream *this,complex<double> *p,int howMany)

{
  std::ostream::write((char *)&this->fOut,(long)p);
  return;
}

Assistant:

void TPZBFileStream::WriteData(const T *p, int howMany) {
    fOut.write(reinterpret_cast<const char *>(p), howMany * sizeof(T));
#ifdef PZDEBUG
    if (fOut.bad()) {
        PZError << "TBFileStream:Could not write to stream" << std::endl;
        DebugStop();
    }
#endif
}